

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O0

void __thiscall helics::apps::Probe::runProbe(Probe *this)

{
  bool bVar1;
  element_type *peVar2;
  pointer pMVar3;
  Endpoint *this_00;
  string *u;
  void *__buf;
  long in_RDI;
  int __flags;
  string_view sVar4;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> message;
  Time ctime;
  Federate *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Endpoint *in_stack_fffffffffffffdb8;
  value<fmt::v11::context> *in_stack_fffffffffffffdc0;
  double local_200;
  char *local_1f8;
  undefined8 local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [48];
  string_view local_198;
  double local_188;
  char *local_180;
  undefined8 local_178;
  undefined1 local_170 [32];
  __sv_type local_150;
  baseType local_138;
  undefined1 local_128 [16];
  double local_118 [4];
  undefined8 local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined8 uStack_e0;
  string_view *local_d8;
  double *local_d0;
  string *local_c8;
  char *local_c0;
  undefined8 uStack_b8;
  undefined1 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  size_t local_88;
  int local_80;
  char *local_78;
  undefined8 uStack_70;
  double *local_68;
  string *local_60;
  char *local_58;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  double local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  double local_30;
  double *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  size_t *local_8;
  
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25f185);
  local_138 = (baseType)
              Federate::getCurrentTime
                        ((Federate *)
                         ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                         (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
  while( true ) {
    bVar1 = Endpoint::hasMessage((Endpoint *)in_stack_fffffffffffffdb0);
    if (!bVar1) break;
    Endpoint::getMessage(in_stack_fffffffffffffdb8);
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x25f1e2);
    local_180 = "Message from {} at Time {}: [{}]";
    local_178 = 0x20;
    pMVar3 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
             operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        0x25f216);
    local_188 = TimeRepresentation::operator_cast_to_double
                          ((TimeRepresentation<count_time<9,_long>_> *)0x25f22e);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x25f241);
    sVar4 = Message::to_string((Message *)0x25f249);
    local_b0 = local_170;
    local_c0 = local_180;
    uStack_b8 = local_178;
    local_d0 = &local_188;
    local_d8 = &local_198;
    local_e8 = local_180;
    uStack_e0 = local_178;
    local_c8 = &pMVar3->source;
    local_198 = sVar4;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              (in_stack_fffffffffffffdc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdb8);
    local_28 = local_118;
    local_30 = *local_d0;
    local_118[0] = local_30;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffdc0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdb8);
    local_18 = &local_f8;
    local_20 = local_128;
    local_f8 = 0xdad;
    local_f0 = local_20;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_00000020,(format_args)in_stack_00000010);
    local_150 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffdb0);
    sVar4._M_str = (char *)in_stack_fffffffffffffdc0;
    sVar4._M_len = (size_t)in_stack_fffffffffffffdb8;
    Federate::logInfoMessage(in_stack_fffffffffffffdb0,sVar4);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdb0);
    *(int *)(in_RDI + 0x11c) = *(int *)(in_RDI + 0x11c) + 1;
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_fffffffffffffdb0);
  }
  this_00 = (Endpoint *)(in_RDI + 0xa0);
  local_1f8 = "message from {},time {}";
  local_1f0 = 0x17;
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25f496);
  u = Federate::getName_abi_cxx11_
                ((Federate *)
                 ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                 (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
  local_200 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x25f4b9);
  local_48 = &local_1e8;
  local_58 = local_1f8;
  uStack_50 = local_1f0;
  local_68 = &local_200;
  local_78 = local_1f8;
  uStack_70 = local_1f0;
  this_01 = &local_a8;
  local_60 = u;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            ((value<fmt::v11::context> *)this_00,local_48);
  local_38 = &local_a8.field_2;
  local_40 = *local_68;
  local_8 = &local_88;
  local_88 = 0xad;
  local_80 = (int)this_01;
  __flags = local_80;
  local_10 = this_01;
  local_a8.field_2._M_allocated_capacity = (size_type)local_40;
  ::fmt::v11::vformat_abi_cxx11_(in_stack_00000020,(format_args)in_stack_00000010);
  data_view::data_view<std::__cxx11::string,void>((data_view *)this_01,u);
  Endpoint::send(this_00,(int)local_1c8,__buf,local_88,__flags);
  data_view::~data_view((data_view *)0x25f5ff);
  std::__cxx11::string::~string(this_01);
  return;
}

Assistant:

void Probe::runProbe()
{
    auto ctime = fed->getCurrentTime();
    while (endpoint.hasMessage()) {
        auto message = endpoint.getMessage();
        fed->logInfoMessage(fmt::format("Message from {} at Time {}: [{}]",
                                        message->source,
                                        static_cast<double>(ctime),
                                        message->to_string()));
        ++messagesReceived;
    }
    endpoint.send(
        fmt::format("message from {},time {}", fed->getName(), static_cast<double>(ctime)));
}